

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item::find_child(Fl_Tree_Item *this,char *name)

{
  Fl_Tree_Item **ppFVar1;
  char *__s1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (name != (char *)0x0) {
    uVar3 = (ulong)(this->_children)._total;
    bVar5 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      ppFVar1 = (this->_children)._items;
      uVar4 = 0;
      do {
        __s1 = ppFVar1[uVar4]->_label;
        if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,name), iVar2 == 0)) {
          if (!bVar5) {
            return -1;
          }
          return (int)uVar4;
        }
        uVar4 = uVar4 + 1;
        bVar5 = uVar4 < uVar3;
      } while (uVar4 != uVar3);
    }
  }
  return -1;
}

Assistant:

int Fl_Tree_Item::find_child(const char *name) {
  if ( name ) {
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(t);
  }
  return(-1);
}